

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message.cpp
# Opt level: O2

void test_cntranslate(string *c,string *s,string *p,int n,string *expected,locale *l,string *domain)

{
  string domain_00;
  string domain_01;
  string *psVar1;
  _Alloc_hider in_stack_fffffffffffffe90;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0 [32];
  string local_90;
  string local_70 [32];
  string local_50;
  
  psVar1 = &local_50;
  std::__cxx11::string::string((string *)psVar1,(string *)c);
  std::__cxx11::string::string((string *)&local_d0,(string *)s);
  std::__cxx11::string::string((string *)&local_f0,(string *)p);
  std::__cxx11::string::string((string *)&local_110,(string *)expected);
  std::__cxx11::string::string(local_70,(string *)domain);
  domain_00._M_string_length = (size_type)psVar1;
  domain_00._M_dataplus._M_p = (pointer)local_70;
  domain_00.field_2._M_allocated_capacity = (size_type)l;
  domain_00.field_2._8_8_ = in_stack_fffffffffffffe90._M_p;
  strings_equal<char>(&local_50,&local_d0,&local_f0,n,&local_110,l,domain_00);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_50);
  psVar1 = &local_90;
  std::__cxx11::string::string((string *)psVar1,(string *)c);
  std::__cxx11::string::string((string *)&local_130,(string *)s);
  std::__cxx11::string::string((string *)&local_150,(string *)p);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffe90,(string *)expected);
  std::__cxx11::string::string(local_b0,(string *)domain);
  domain_01._M_string_length = (size_type)psVar1;
  domain_01._M_dataplus._M_p = (pointer)local_b0;
  domain_01.field_2._M_allocated_capacity = (size_type)l;
  domain_01.field_2._8_8_ = in_stack_fffffffffffffe90._M_p;
  strings_equal<wchar_t>
            (&local_90,&local_130,&local_150,n,(string *)&stack0xfffffffffffffe90,l,domain_01);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe90);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void test_cntranslate(std::string c,std::string s,std::string p,int n,std::string expected,std::locale const &l,std::string domain)
{
    strings_equal<char>(c,s,p,n,expected,l,domain);
    strings_equal<wchar_t>(c,s,p,n,expected,l,domain);
    #ifdef BOOSTER_HAS_CHAR16_T
    if(backend=="icu" || backend=="std")
        strings_equal<char16_t>(c,s,p,n,expected,l,domain);
    #endif
    #ifdef BOOSTER_HAS_CHAR32_T
    if(backend=="icu" || backend=="std")
        strings_equal<char32_t>(c,s,p,n,expected,l,domain);
    #endif
}